

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O1

void __thiscall
QBlitterPaintEnginePrivate::fillRect
          (QBlitterPaintEnginePrivate *this,QRectF *rect,QColor *color,bool alpha)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QPaintEngine *this_00;
  undefined4 uVar3;
  undefined4 uVar4;
  qreal qVar5;
  qreal qVar6;
  CompositionMode CVar7;
  int iVar8;
  int iVar9;
  QRect *this_01;
  const_iterator pQVar10;
  QBlittable *pQVar11;
  QPaintDevice *pQVar12;
  _func_int **pp_Var13;
  QClipData *pQVar14;
  QPaintEngineState *pQVar15;
  QRectF *pQVar16;
  QRect *rect_1;
  long in_FS_OFFSET;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  QRectF local_98;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QRasterPaintEnginePrivate).super_QPaintEngineExPrivate.
            super_QPaintEnginePrivate.q_ptr;
  local_58.xp = rect->xp;
  local_58.yp = rect->yp;
  local_58.w = rect->w;
  local_58.h = rect->h;
  if (this->hasXForm != 0) {
    pQVar15 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar15 = (QPaintEngineState *)0x0;
    }
    QTransform::mapRect(&local_58,(QTransform *)(pQVar15 + 0x36),rect);
  }
  qVar5 = local_58.w;
  pQVar15 = ((this->super_QRasterPaintEnginePrivate).super_QPaintEngineExPrivate.
             super_QPaintEnginePrivate.q_ptr)->state;
  if (((pQVar15 == (QPaintEngineState *)0x0) ||
      (pQVar14 = *(QClipData **)(pQVar15 + 0x100), pQVar14 == (QClipData *)0x0)) ||
     ((pQVar14->field_0x48 & 1) == 0)) {
    pQVar14 = (this->super_QRasterPaintEnginePrivate).baseClip.d;
  }
  if (pQVar14 == (QClipData *)0x0) {
    if ((0.0 <= local_58.xp) && (0.0 <= local_58.yp)) {
      pQVar12 = QPaintEngine::paintDevice(this_00);
      iVar8 = (*pQVar12->_vptr_QPaintDevice[4])(pQVar12,1);
      qVar6 = local_58.h;
      if (qVar5 <= (double)iVar8) {
        pQVar12 = QPaintEngine::paintDevice(this_00);
        iVar8 = (*pQVar12->_vptr_QPaintDevice[4])(pQVar12,2);
        if (qVar6 <= (double)iVar8) {
          pQVar11 = QBlittablePlatformPixmap::blittable(this->pmData);
          QBlittable::unlock(pQVar11);
          pQVar11 = QBlittablePlatformPixmap::blittable(this->pmData);
          if (!alpha) {
            pp_Var13 = pQVar11->_vptr_QBlittable;
            pQVar16 = &local_58;
            goto LAB_003b90d0;
          }
          pQVar15 = this_00->state + -2;
          if (this_00->state == (QPaintEngineState *)0x0) {
            pQVar15 = (QPaintEngineState *)0x0;
          }
          CVar7 = QPaintEngineState::compositionMode(pQVar15 + 2);
          pp_Var13 = pQVar11->_vptr_QBlittable;
          pQVar16 = &local_58;
          goto LAB_003b902c;
        }
      }
    }
    local_78.w = -NAN;
    local_78.h = -NAN;
    local_78.xp = -NAN;
    local_78.yp = -NAN;
    pQVar12 = QPaintEngine::paintDevice(this_00);
    iVar8 = (*pQVar12->_vptr_QPaintDevice[4])(pQVar12,1);
    pQVar12 = QPaintEngine::paintDevice(this_00);
    iVar9 = (*pQVar12->_vptr_QPaintDevice[4])(pQVar12,2);
    local_78.h = (qreal)iVar9;
    local_78.xp = 0.0;
    local_78.yp = 0.0;
    local_78.w = (double)iVar8;
    pQVar11 = QBlittablePlatformPixmap::blittable(this->pmData);
    QBlittable::unlock(pQVar11);
    pQVar11 = QBlittablePlatformPixmap::blittable(this->pmData);
    if (!alpha) {
      pQVar16 = &local_98;
      QRectF::operator&(pQVar16,&local_78);
      pp_Var13 = pQVar11->_vptr_QBlittable;
LAB_003b90d0:
      (*pp_Var13[2])(pQVar11,pQVar16,color);
      goto LAB_003b90d8;
    }
    pQVar16 = &local_98;
    QRectF::operator&(pQVar16,&local_78);
    pQVar15 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar15 = (QPaintEngineState *)0x0;
    }
    CVar7 = QPaintEngineState::compositionMode(pQVar15 + 2);
    pp_Var13 = pQVar11->_vptr_QBlittable;
  }
  else {
    if ((pQVar14->field_0x48 & 2) == 0) {
      if ((pQVar14->field_0x48 & 4) != 0) {
        this_01 = QRegion::begin(&pQVar14->clipRegion);
        pQVar10 = QRegion::end(&pQVar14->clipRegion);
        for (; this_01 != pQVar10; this_01 = this_01 + 1) {
          dVar19 = (double)((ulong)local_58.xp & 0x8000000000000000 | 0x3fe0000000000000) +
                   local_58.xp;
          dVar21 = 2147483647.0;
          if (dVar19 <= 2147483647.0) {
            dVar21 = dVar19;
          }
          if (dVar21 <= -2147483648.0) {
            dVar21 = -2147483648.0;
          }
          dVar20 = (double)((ulong)local_58.yp & 0x8000000000000000 | 0x3fe0000000000000) +
                   local_58.yp;
          dVar19 = 2147483647.0;
          if (dVar20 <= 2147483647.0) {
            dVar19 = dVar20;
          }
          if (dVar19 <= -2147483648.0) {
            dVar19 = -2147483648.0;
          }
          dVar18 = (local_58.xp - (double)(int)dVar21) * 0.5 + local_58.w;
          dVar18 = (double)((ulong)dVar18 & 0x8000000000000000 | 0x3fe0000000000000) + dVar18;
          dVar20 = 2147483647.0;
          if (dVar18 <= 2147483647.0) {
            dVar20 = dVar18;
          }
          if (dVar20 <= -2147483648.0) {
            dVar20 = -2147483648.0;
          }
          dVar17 = (local_58.yp - (double)(int)dVar19) * 0.5 + local_58.h;
          dVar17 = (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
          dVar18 = 2147483647.0;
          if (dVar17 <= 2147483647.0) {
            dVar18 = dVar17;
          }
          if (dVar18 <= -2147483648.0) {
            dVar18 = -2147483648.0;
          }
          local_78.xp = (qreal)CONCAT44((int)dVar19,(int)dVar21);
          local_78.yp = (qreal)CONCAT44((int)dVar18 + (int)dVar19 + -1,
                                        (int)dVar20 + (int)dVar21 + -1);
          auVar22 = QRect::operator&(this_01,(QRect *)&local_78);
          iVar8 = auVar22._0_4_;
          if (auVar22._4_4_ <= auVar22._12_4_ && iVar8 <= auVar22._8_4_) {
            pQVar11 = QBlittablePlatformPixmap::blittable(this->pmData);
            QBlittable::unlock(pQVar11);
            pQVar11 = QBlittablePlatformPixmap::blittable(this->pmData);
            local_78.xp = (qreal)iVar8;
            local_78.yp = (qreal)auVar22._4_4_;
            local_78.w = (qreal)(((long)auVar22._8_4_ - (long)iVar8) + 1);
            local_78.h = (qreal)(((auVar22._8_8_ >> 0x20) - (auVar22._0_8_ >> 0x20)) + 1);
            if (alpha) {
              pQVar15 = this_00->state + -2;
              if (this_00->state == (QPaintEngineState *)0x0) {
                pQVar15 = (QPaintEngineState *)0x0;
              }
              CVar7 = QPaintEngineState::compositionMode(pQVar15 + 2);
              (*pQVar11->_vptr_QBlittable[4])(pQVar11,&local_78,color,(ulong)CVar7);
            }
            else {
              (*pQVar11->_vptr_QBlittable[2])(pQVar11,&local_78,color);
            }
          }
        }
      }
      goto LAB_003b90d8;
    }
    pQVar11 = QBlittablePlatformPixmap::blittable(this->pmData);
    QBlittable::unlock(pQVar11);
    pQVar11 = QBlittablePlatformPixmap::blittable(this->pmData);
    if (!alpha) {
      uVar2 = (pQVar14->clipRect).x1;
      uVar4 = (pQVar14->clipRect).y1;
      local_98.xp = (qreal)(int)uVar2;
      local_98.yp = (qreal)(int)uVar4;
      local_98.w = (qreal)(((long)(pQVar14->clipRect).x2.m_i - (long)(int)uVar2) + 1);
      local_98.h = (qreal)(((long)(pQVar14->clipRect).y2.m_i - (long)(int)uVar4) + 1);
      pQVar16 = &local_78;
      QRectF::operator&(pQVar16,&local_58);
      pp_Var13 = pQVar11->_vptr_QBlittable;
      goto LAB_003b90d0;
    }
    uVar1 = (pQVar14->clipRect).x1;
    uVar3 = (pQVar14->clipRect).y1;
    local_98.xp = (qreal)(int)uVar1;
    local_98.yp = (qreal)(int)uVar3;
    local_98.w = (qreal)(((long)(pQVar14->clipRect).x2.m_i - (long)(int)uVar1) + 1);
    local_98.h = (qreal)(((long)(pQVar14->clipRect).y2.m_i - (long)(int)uVar3) + 1);
    pQVar16 = &local_78;
    QRectF::operator&(pQVar16,&local_58);
    pQVar15 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar15 = (QPaintEngineState *)0x0;
    }
    CVar7 = QPaintEngineState::compositionMode(pQVar15 + 2);
    pp_Var13 = pQVar11->_vptr_QBlittable;
  }
LAB_003b902c:
  (*pp_Var13[4])(pQVar11,pQVar16,color,(ulong)CVar7);
LAB_003b90d8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBlitterPaintEnginePrivate::fillRect(const QRectF &rect, const QColor &color, bool alpha)
{
    Q_Q(QBlitterPaintEngine);
    pmData->unmarkRasterOverlay(rect);
    QRectF targetRect = rect;
    if (hasXForm)
        targetRect = q->state()->matrix.mapRect(rect);
    const QClipData *clipData = clip();
    if (clipData) {
        if (clipData->hasRectClip) {
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(targetRect & clipData->clipRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(targetRect & clipData->clipRect, color);
        } else if (clipData->hasRegionClip) {
            for (const QRect &rect : clipData->clipRegion) {
                QRect intersectRect = rect.intersected(targetRect.toRect());
                if (!intersectRect.isEmpty()) {
                    unlock();
                    if (alpha)
                        pmData->blittable()->alphaFillRect(intersectRect, color, q->state()->compositionMode());
                    else
                        pmData->blittable()->fillRect(intersectRect, color);
                }
            }
        }
    } else {
        if (targetRect.x() >= 0 && targetRect.y() >= 0
            && targetRect.width() <= q->paintDevice()->width()
            && targetRect.height() <= q->paintDevice()->height()) {
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(targetRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(targetRect, color);
        } else {
            QRectF deviceRect(0, 0, q->paintDevice()->width(), q->paintDevice()->height());
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(deviceRect & targetRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(deviceRect & targetRect, color);
        }
    }
}